

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O1

char * get_mem_options_inner(json_t *root,char *option_name,int *result,int should_free)

{
  json_t *json;
  size_t sVar1;
  char *__dest;
  char *__src;
  
  json = json_object_get(root,option_name);
  if (json == (json_t *)0x0) {
    if (((root != (json_t *)0x0 && should_free != 0) && (root->refcount != 0xffffffffffffffff)) &&
       (sVar1 = root->refcount - 1, root->refcount = sVar1, sVar1 == 0)) {
      json_delete(root);
    }
    *result = 0;
  }
  else {
    if (json->type == JSON_MEM) {
      sVar1 = json_mem_length(json);
      __dest = (char *)malloc(sVar1);
      __src = json_mem_value(json);
      memcpy(__dest,__src,sVar1);
      *result = 1;
      if (root == (json_t *)0x0 || should_free == 0) {
        return __dest;
      }
      if (root->refcount == 0xffffffffffffffff) {
        return __dest;
      }
      sVar1 = root->refcount - 1;
      root->refcount = sVar1;
      if (sVar1 != 0) {
        return __dest;
      }
      json_delete(root);
      return __dest;
    }
    *result = -1;
    fprintf(_stderr,"error: option item %s is expected to be a mem\n",option_name);
    if (root == (json_t *)0x0 || should_free == 0) {
      return (char *)0x0;
    }
    if ((root->refcount != 0xffffffffffffffff) &&
       (sVar1 = root->refcount - 1, root->refcount = sVar1, sVar1 == 0)) {
      json_delete(root);
    }
  }
  return (char *)0x0;
}

Assistant:

static char * get_mem_options_inner(json_t * root, const char * option_name, int * result, int should_free)
{
	json_t *option_item;
	char * option_value;
	size_t length;

	option_item = json_object_get(root, option_name);
	if (!option_item)
	{
		if (should_free)
			json_decref(root);
		*result = 0;
		return NULL;
	}

	if (!json_is_mem(option_item))
	{
		*result = -1;
		fprintf(stderr, "error: option item %s is expected to be a mem\n", option_name);
		if (should_free)
			json_decref(root);
		return NULL;
	}

	length = json_mem_length(option_item);
	option_value = malloc(length);
	memcpy(option_value, json_mem_value(option_item), length);
	*result = 1;
	if (should_free)
		json_decref(root);
	return option_value;
}